

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::OneHotLayerParams::MergeFrom(OneHotLayerParams *this,OneHotLayerParams *from)

{
  ulong uVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xe336);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (from->onehotvectorsize_ != 0) {
    this->onehotvectorsize_ = from->onehotvectorsize_;
  }
  if (from->axis_ != 0) {
    this->axis_ = from->axis_;
  }
  if (from->onvalue_ != 0.0) {
    this->onvalue_ = from->onvalue_;
  }
  if (from->offvalue_ != 0.0) {
    this->offvalue_ = from->offvalue_;
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void OneHotLayerParams::MergeFrom(const OneHotLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.OneHotLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_onehotvectorsize() != 0) {
    _internal_set_onehotvectorsize(from._internal_onehotvectorsize());
  }
  if (from._internal_axis() != 0) {
    _internal_set_axis(from._internal_axis());
  }
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_onvalue = from._internal_onvalue();
  uint32_t raw_onvalue;
  memcpy(&raw_onvalue, &tmp_onvalue, sizeof(tmp_onvalue));
  if (raw_onvalue != 0) {
    _internal_set_onvalue(from._internal_onvalue());
  }
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_offvalue = from._internal_offvalue();
  uint32_t raw_offvalue;
  memcpy(&raw_offvalue, &tmp_offvalue, sizeof(tmp_offvalue));
  if (raw_offvalue != 0) {
    _internal_set_offvalue(from._internal_offvalue());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}